

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O0

aom_codec_err_t encoder_init(aom_codec_ctx_t *ctx)

{
  long lVar1;
  int iVar2;
  aom_codec_enc_cfg_t *cfg;
  AV1_PRIMARY *pAVar3;
  long in_RDI;
  AV1EncoderConfig *in_stack_00000018;
  int in_stack_00000024;
  aom_codec_pkt_list *in_stack_00000028;
  int i;
  int size;
  int lap_lag_in_frames;
  int *num_lap_buffers;
  aom_codec_alg_priv_t_conflict *priv;
  aom_codec_err_t res;
  av1_extracfg *in_stack_00000080;
  aom_codec_enc_cfg_t *in_stack_00000088;
  AV1EncoderConfig *in_stack_00000090;
  undefined8 in_stack_ffffffffffffff98;
  STATS_BUFFER_CTX *in_stack_ffffffffffffffa0;
  FIRSTPASS_STATS **in_stack_ffffffffffffffa8;
  uint *puVar4;
  AV1EncoderConfig *in_stack_ffffffffffffffb0;
  AV1EncoderConfig *oxcf;
  undefined4 in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  uint in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffc8;
  int iVar5;
  int local_2c;
  av1_extracfg *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  aom_codec_err_t local_4;
  
  iVar2 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  local_4 = AOM_CODEC_OK;
  if (*(long *)(in_RDI + 0x30) == 0) {
    cfg = (aom_codec_enc_cfg_t *)
          aom_calloc((size_t)in_stack_ffffffffffffffa8,(size_t)in_stack_ffffffffffffffa0);
    if (cfg == (aom_codec_enc_cfg_t *)0x0) {
      local_4 = AOM_CODEC_MEM_ERROR;
    }
    else {
      *(aom_codec_enc_cfg_t **)(in_RDI + 0x30) = cfg;
      *(undefined8 *)(*(long *)(in_RDI + 0x30) + 8) = *(undefined8 *)(in_RDI + 0x20);
      memcpy(&cfg->monochrome,*(void **)(in_RDI + 0x28),0x388);
      *(uint **)(in_RDI + 0x28) = &cfg->monochrome;
      memcpy(&cfg[1].monochrome,&default_extra_cfg,600);
      if (cfg->monochrome == 2) {
        cfg[1].tile_widths[0x1d] = 0;
        cfg[1].tile_widths[0x26] = 4;
        cfg[1].tile_widths[0x27] = 10;
      }
      av1_initialize_enc((uint)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                         (aom_rc_mode)in_stack_ffffffffffffffa0);
      local_4 = validate_config((aom_codec_alg_priv_t_conflict *)
                                CONCAT44(local_4,in_stack_ffffffffffffffe8),cfg,
                                in_stack_ffffffffffffffd8);
      if (local_4 == AOM_CODEC_OK) {
        puVar4 = &cfg[0x33].save_as_annexb;
        local_2c = 0;
        *puVar4 = 0;
        cfg[1].encoder_cfg.disable_dist_wtd_comp = cfg->tile_widths[6];
        *(long *)&cfg[1].encoder_cfg.disable_warp_motion = (long)cfg->tile_widths[5] * 10000000;
        reduce_ratio((aom_rational64_t *)in_stack_ffffffffffffffb0);
        set_encoder_config(in_stack_00000090,in_stack_00000088,in_stack_00000080);
        if (((*(int *)((long)&cfg[2].rc_firstpass_mb_stats_in.buf + 4) != 1) &&
            ((int)cfg[3].rc_twopass_stats_in.sz == 0)) && ((char)cfg[3].rc_target_bitrate == '\0'))
        {
          in_stack_ffffffffffffffc8 = cfg->tile_widths[9];
          if ((int)(cfg[2].g_h + 0x10) < 0x31) {
            in_stack_ffffffffffffffc4 = cfg[2].g_h + 0x10;
          }
          else {
            in_stack_ffffffffffffffc4 = 0x30;
          }
          if (in_stack_ffffffffffffffc8 < in_stack_ffffffffffffffc4) {
            in_stack_ffffffffffffffc0 = cfg->tile_widths[9];
          }
          else if ((int)(cfg[2].g_h + 0x10) < 0x31) {
            in_stack_ffffffffffffffbc = cfg[2].g_h + 0x10;
            in_stack_ffffffffffffffc0 = in_stack_ffffffffffffffbc;
          }
          else {
            in_stack_ffffffffffffffbc = 0x30;
            in_stack_ffffffffffffffc0 = in_stack_ffffffffffffffbc;
          }
          *puVar4 = in_stack_ffffffffffffffc0;
          if (0x10 < (int)(cfg->tile_widths[9] - *puVar4)) {
            local_2c = 0x11;
          }
        }
        *(bool *)((long)&cfg[3].rc_target_bitrate + 3) = (*(ulong *)(in_RDI + 0x20) & 0x40000) != 0;
        *(bool *)(cfg[0x33].tile_widths + 9) = cfg->tile_widths[0x2f] != 0;
        pAVar3 = av1_create_primary_compressor
                           (in_stack_00000028,in_stack_00000024,in_stack_00000018);
        *(AV1_PRIMARY **)&cfg[3].kf_mode = pAVar3;
        lVar1._0_4_ = cfg[3].kf_mode;
        lVar1._4_4_ = cfg[3].kf_min_dist;
        if (lVar1 == 0) {
          local_4 = AOM_CODEC_MEM_ERROR;
        }
        else {
          local_4 = create_stats_buffer(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,iVar2);
          if (local_4 == AOM_CODEC_OK) {
            iVar2 = get_stats_buf_size(*puVar4,0x30);
            for (iVar5 = 0; iVar5 < iVar2; iVar5 = iVar5 + 1) {
              *(long *)(*(long *)&cfg[3].kf_mode + 0x5bc8 + (long)iVar5 * 8) =
                   *(long *)&cfg[0x33].monochrome + (long)iVar5 * 0xe8;
            }
            *(int **)(*(long *)&cfg[3].kf_mode + 0x5d58) = &cfg[0x33].tile_height_count;
            local_4 = av1_create_context_and_bufferpool
                                ((AV1_PRIMARY *)CONCAT44(iVar5,in_stack_ffffffffffffffc8),
                                 (AV1_COMP **)
                                 CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                                 (BufferPool **)
                                 CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                                 in_stack_ffffffffffffffb0,
                                 (COMPRESSOR_STAGE)((ulong)in_stack_ffffffffffffffa8 >> 0x38),
                                 (int)in_stack_ffffffffffffffa8);
            if (local_4 == AOM_CODEC_OK) {
              *(undefined8 *)(**(long **)&cfg[3].kf_mode + 0x9d618) =
                   **(undefined8 **)(*(long *)&cfg[3].kf_mode + 0x5d58);
              *(undefined8 *)(*(long *)&cfg[3].kf_mode + 0x160) = **(undefined8 **)&cfg[3].kf_mode;
              if (*puVar4 != 0) {
                puVar4 = &cfg[0x33].sframe_mode;
                oxcf = (AV1EncoderConfig *)&cfg[1].encoder_cfg.disable_intrabc;
                clamp(local_2c,0,0x30);
                local_4 = av1_create_context_and_bufferpool
                                    ((AV1_PRIMARY *)CONCAT44(iVar5,in_stack_ffffffffffffffc8),
                                     (AV1_COMP **)
                                     CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                                     (BufferPool **)
                                     CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                                     oxcf,(COMPRESSOR_STAGE)((ulong)puVar4 >> 0x38),(int)puVar4);
              }
            }
            else {
              *(char **)cfg = "av1_create_context_and_bufferpool() failed";
            }
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

static aom_codec_err_t encoder_init(aom_codec_ctx_t *ctx) {
  aom_codec_err_t res = AOM_CODEC_OK;

  if (ctx->priv == NULL) {
    aom_codec_alg_priv_t *const priv = aom_calloc(1, sizeof(*priv));
    if (priv == NULL) return AOM_CODEC_MEM_ERROR;

    ctx->priv = (aom_codec_priv_t *)priv;
    ctx->priv->init_flags = ctx->init_flags;

    // Update the reference to the config structure to an internal copy.
    assert(ctx->config.enc);
    priv->cfg = *ctx->config.enc;
    ctx->config.enc = &priv->cfg;

    priv->extra_cfg = default_extra_cfg;
    // Special handling:
    // By default, if omitted: --enable-cdef=1, --qm-min=5, and --qm-max=9
    // Here we set its default values to 0, 4, and 10 respectively when
    // --allintra is turned on.
    // However, if users set --enable-cdef, --qm-min, or --qm-max, either from
    // the command line or aom_codec_control(), the encoder still respects it.
    if (priv->cfg.g_usage == AOM_USAGE_ALL_INTRA) {
      // CDEF has been found to blur images, so it's disabled in all-intra mode
      priv->extra_cfg.enable_cdef = 0;
      // These QM min/max values have been found to be beneficial for images,
      // when used with an alternative QM formula (see
      // aom_get_qmlevel_allintra()).
      // These values could also be beneficial for other usage modes, but
      // further testing is required.
      priv->extra_cfg.qm_min = DEFAULT_QM_FIRST_ALLINTRA;
      priv->extra_cfg.qm_max = DEFAULT_QM_LAST_ALLINTRA;
    }
    av1_initialize_enc(priv->cfg.g_usage, priv->cfg.rc_end_usage);

    res = validate_config(priv, &priv->cfg, &priv->extra_cfg);

    if (res == AOM_CODEC_OK) {
      int *num_lap_buffers = &priv->num_lap_buffers;
      int lap_lag_in_frames = 0;
      *num_lap_buffers = 0;
      priv->timestamp_ratio.den = priv->cfg.g_timebase.den;
      priv->timestamp_ratio.num =
          (int64_t)priv->cfg.g_timebase.num * TICKS_PER_SEC;
      reduce_ratio(&priv->timestamp_ratio);

      set_encoder_config(&priv->oxcf, &priv->cfg, &priv->extra_cfg);
      if (priv->oxcf.rc_cfg.mode != AOM_CBR &&
          priv->oxcf.pass == AOM_RC_ONE_PASS && priv->oxcf.mode == GOOD) {
        // Enable look ahead - enabled for AOM_Q, AOM_CQ, AOM_VBR
        *num_lap_buffers =
            AOMMIN((int)priv->cfg.g_lag_in_frames,
                   AOMMIN(MAX_LAP_BUFFERS, priv->oxcf.kf_cfg.key_freq_max +
                                               SCENE_CUT_KEY_TEST_INTERVAL));
        if ((int)priv->cfg.g_lag_in_frames - (*num_lap_buffers) >=
            LAP_LAG_IN_FRAMES) {
          lap_lag_in_frames = LAP_LAG_IN_FRAMES;
        }
      }
      priv->oxcf.use_highbitdepth =
          (ctx->init_flags & AOM_CODEC_USE_HIGHBITDEPTH) ? 1 : 0;

      priv->monochrome_on_init = priv->cfg.monochrome;

      priv->ppi = av1_create_primary_compressor(&priv->pkt_list.head,
                                                *num_lap_buffers, &priv->oxcf);
      if (!priv->ppi) return AOM_CODEC_MEM_ERROR;

#if !CONFIG_REALTIME_ONLY
      res = create_stats_buffer(&priv->frame_stats_buffer,
                                &priv->stats_buf_context, *num_lap_buffers);
      if (res != AOM_CODEC_OK) return res;

      assert(MAX_LAP_BUFFERS >= MAX_LAG_BUFFERS);
      int size = get_stats_buf_size(*num_lap_buffers, MAX_LAG_BUFFERS);
      for (int i = 0; i < size; i++)
        priv->ppi->twopass.frame_stats_arr[i] = &priv->frame_stats_buffer[i];

      priv->ppi->twopass.stats_buf_ctx = &priv->stats_buf_context;
#endif

      assert(priv->ppi->num_fp_contexts >= 1);
      res = av1_create_context_and_bufferpool(
          priv->ppi, &priv->ppi->parallel_cpi[0], &priv->buffer_pool,
          &priv->oxcf, ENCODE_STAGE, -1);
      if (res != AOM_CODEC_OK) {
        priv->base.err_detail = "av1_create_context_and_bufferpool() failed";
        return res;
      }
#if !CONFIG_REALTIME_ONLY
      priv->ppi->parallel_cpi[0]->twopass_frame.stats_in =
          priv->ppi->twopass.stats_buf_ctx->stats_in_start;
#endif
      priv->ppi->cpi = priv->ppi->parallel_cpi[0];

      // Create another compressor if look ahead is enabled
      if (res == AOM_CODEC_OK && *num_lap_buffers) {
        res = av1_create_context_and_bufferpool(
            priv->ppi, &priv->ppi->cpi_lap, &priv->buffer_pool_lap, &priv->oxcf,
            LAP_STAGE, clamp(lap_lag_in_frames, 0, MAX_LAG_BUFFERS));
      }
    }
  }

  return res;
}